

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O2

void __thiscall bdNode::pingRelayServers(bdNode *this)

{
  list<bdNodeId,_std::allocator<bdNodeId>_> *plVar1;
  list<bdNodeId,_std::allocator<bdNodeId>_> peerList;
  
  peerList.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&peerList;
  plVar1 = &peerList;
  peerList.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&peerList;
  peerList.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>._M_impl._M_node._M_size = 0;
  bdFriendList::findPeersWithFlags(&this->mFriendList,0x80000,&peerList);
  while (plVar1 = *(list<bdNodeId,_std::allocator<bdNodeId>_> **)plVar1, plVar1 != &peerList) {
    bdQueryManager::addQuery(this->mQueryMgr,(bdNodeId *)((long)plVar1 + 0x10),5);
  }
  std::__cxx11::_List_base<bdNodeId,_std::allocator<bdNodeId>_>::_M_clear
            (&peerList.super__List_base<bdNodeId,_std::allocator<bdNodeId>_>);
  return;
}

Assistant:

void bdNode::pingRelayServers() {
	/* if Relay's have been switched on, do search/ping to locate servers */
#ifdef DEBUG_NODE_MSGS
	std::cerr << "bdNode::pingRelayServers()";
	std::cerr << std::endl;
#endif

	bool doSearch = true;

	uint32_t flags = BITDHT_PEER_STATUS_DHT_RELAY_SERVER;
	std::list<bdNodeId> peerList;
	std::list<bdNodeId>::iterator it;

	mFriendList.findPeersWithFlags(flags, peerList);
	for (it = peerList.begin(); it != peerList.end(); it++) {
		if (doSearch) {
			uint32_t qflags = BITDHT_QFLAGS_INTERNAL | BITDHT_QFLAGS_DISGUISE;
			mQueryMgr->addQuery(&(*it), qflags);

#ifdef DEBUG_NODE_MSGS
			std::cerr << "bdNode::pingRelayServers() Adding Internal Search for Relay Server: ";
			mFns->bdPrintNodeId(std::cerr, &(*it));
			std::cerr << std::endl;
#endif

		}
        /* try ping - if we have an address??? */
	}
}